

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigAndCreateFrom(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1,Abc_Obj_t *pAnd)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  uint Key;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pAnd_local;
  Abc_Obj_t *p1_local;
  Abc_Obj_t *p0_local;
  Abc_Aig_t *pMan_local;
  
  iVar1 = Abc_ObjIsComplement(pAnd);
  if (iVar1 == 0) {
    pAVar3 = Abc_ObjRegular(p0);
    iVar1 = pAVar3->Id;
    pAVar3 = Abc_ObjRegular(p1);
    pAnd_local = p1;
    p1_local = p0;
    if (pAVar3->Id < iVar1) {
      pAnd_local = p0;
      p1_local = p1;
    }
    Abc_ObjAddFanin(pAnd,p1_local);
    Abc_ObjAddFanin(pAnd,pAnd_local);
    pAVar3 = Abc_ObjRegular(p1_local);
    uVar2 = *(uint *)&pAVar3->field_0x14;
    pAVar3 = Abc_ObjRegular(pAnd_local);
    iVar1 = Abc_MaxInt(uVar2 >> 0xc,*(uint *)&pAVar3->field_0x14 >> 0xc);
    *(uint *)&pAnd->field_0x14 = *(uint *)&pAnd->field_0x14 & 0xfff | (iVar1 + 1) * 0x1000;
    uVar2 = Abc_NodeIsExorType(pAnd);
    *(uint *)&pAnd->field_0x14 = *(uint *)&pAnd->field_0x14 & 0xfffffeff | (uVar2 & 1) << 8;
    uVar2 = Abc_HashKey2(p1_local,pAnd_local,pMan->nBins);
    pAnd->pNext = pMan->pBins[uVar2];
    pMan->pBins[uVar2] = pAnd;
    pMan->nEntries = pMan->nEntries + 1;
    (pAnd->field_6).pTemp = (void *)0x0;
    return pAnd;
  }
  __assert_fail("!Abc_ObjIsComplement(pAnd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcAig.c"
                ,0x16f,
                "Abc_Obj_t *Abc_AigAndCreateFrom(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)"
               );
}

Assistant:

Abc_Obj_t * Abc_AigAndCreateFrom( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1, Abc_Obj_t * pAnd )
{
    Abc_Obj_t * pTemp;
    unsigned Key;
    assert( !Abc_ObjIsComplement(pAnd) );
    // order the arguments
    if ( Abc_ObjRegular(p0)->Id > Abc_ObjRegular(p1)->Id )
        pTemp = p0, p0 = p1, p1 = pTemp;
    // create the new node
    Abc_ObjAddFanin( pAnd, p0 );
    Abc_ObjAddFanin( pAnd, p1 );
    // set the level of the new node
    pAnd->Level      = 1 + Abc_MaxInt( Abc_ObjRegular(p0)->Level, Abc_ObjRegular(p1)->Level ); 
    pAnd->fExor      = Abc_NodeIsExorType(pAnd);
    // add the node to the corresponding linked list in the table
    Key = Abc_HashKey2( p0, p1, pMan->nBins );
    pAnd->pNext      = pMan->pBins[Key];
    pMan->pBins[Key] = pAnd;
    pMan->nEntries++;
    // create the cuts if defined
//    if ( pAnd->pNtk->pManCut )
//        Abc_NodeGetCuts( pAnd->pNtk->pManCut, pAnd );
    pAnd->pCopy = NULL;
    // add the node to the list of updated nodes
//    if ( pMan->vAddedCells )
//        Vec_PtrPush( pMan->vAddedCells, pAnd );
    return pAnd;
}